

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

void * lzham::task_pool::thread_func(void *pContext)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  task tsk;
  task_pool *pPool;
  task *in_stack_ffffffffffffffc8;
  task_pool *in_stack_ffffffffffffffd0;
  task *in_stack_ffffffffffffffd8;
  anon_union_8_2_408cf123_for_task_2 in_stack_ffffffffffffffe0;
  
  task::task((task *)&stack0xffffffffffffffd0);
  while ((uVar2 = semaphore::wait((semaphore *)(in_RDI + 0xa18),(void *)0xffffffff),
         (uVar2 & 1) != 0 && (*(long *)(in_RDI + 0xa48) == 0))) {
    bVar1 = tsstack<lzham::task_pool::task,_64U>::pop
                      ((tsstack<lzham::task_pool::task,_64U> *)in_stack_ffffffffffffffe0.m_pObj,
                       in_stack_ffffffffffffffd8);
    if (bVar1) {
      process_task(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return (void *)0x0;
}

Assistant:

void * task_pool::thread_func(void *pContext)
   {
      task_pool* pPool = static_cast<task_pool*>(pContext);
      task tsk;

      for ( ; ; )
      {
         if (!pPool->m_tasks_available.wait())
            break;

         if (pPool->m_exit_flag)
            break;

         if (pPool->m_task_stack.pop(tsk))
         {
            pPool->process_task(tsk);
         }
      }

      return NULL;
   }